

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ACInfoWnd.cpp
# Opt level: O0

string * __thiscall ACIWnd::GetWndTitle_abi_cxx11_(ACIWnd *this)

{
  bool bVar1;
  long in_RSI;
  string *in_RDI;
  allocator<char> *in_stack_ffffffffffffff70;
  string *__lhs;
  bool local_69;
  string local_68 [8];
  string *in_stack_ffffffffffffffa0;
  FDStaticData *in_stack_ffffffffffffffa8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffffb0;
  allocator<char> local_31;
  string local_30 [48];
  
  __lhs = in_RDI;
  bVar1 = LTFlightData::FDKeyTy::empty((FDKeyTy *)0x11e8cd);
  if (bVar1) {
    in_stack_ffffffffffffff70 = &local_31;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (in_stack_ffffffffffffffb0,(char *)in_stack_ffffffffffffffa8,
               (allocator<char> *)in_stack_ffffffffffffffa0);
  }
  else {
    LTFlightData::FDKeyTy::operator_cast_to_string((FDKeyTy *)(in_RSI + 400));
    LTFlightData::FDStaticData::acId(in_stack_ffffffffffffffa8,in_stack_ffffffffffffffa0);
  }
  std::operator+(__lhs,(char *)in_stack_ffffffffffffff70);
  std::__cxx11::string::~string(local_30);
  if (bVar1) {
    std::allocator<char>::~allocator(&local_31);
  }
  else {
    std::__cxx11::string::~string(local_68);
  }
  return in_RDI;
}

Assistant:

std::string ACIWnd::GetWndTitle () const
{
    return
    (acKey.empty() ? std::string(ACI_WND_TITLE) : stat.acId(std::string(acKey))) +
    (bAuto ? " (AUTO)" : "");
}